

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O0

void do_permonst(char *outfile)

{
  int iVar1;
  char *pcVar2;
  char *nam;
  char *c;
  int i;
  char *outfile_local;
  
  ofp = (FILE *)fopen(outfile,"w+");
  if ((FILE *)ofp != (FILE *)0x0) {
    fprintf((FILE *)ofp,"%s",Dont_Edit_Code);
    fprintf((FILE *)ofp,"#ifndef PM_H\n#define PM_H\n");
    iVar1 = strcmp("giant ant","playermon");
    if (iVar1 != 0) {
      fprintf((FILE *)ofp,"\n#define\tPM_PLAYERMON\t(-1)");
    }
    c._4_4_ = 0;
    while (mons[(int)c._4_4_].mlet != '\0') {
      fprintf((FILE *)ofp,"\n#define\tPM_");
      if ((mons[(int)c._4_4_].mlet == '5') &&
         (iVar1 = strncmp(mons[(int)c._4_4_].mname,"were",4), iVar1 == 0)) {
        fprintf((FILE *)ofp,"HUMAN_");
      }
      pcVar2 = tmpdup(mons[(int)c._4_4_].mname);
      for (nam = pcVar2; *nam != '\0'; nam = nam + 1) {
        if ((*nam < 'a') || ('z' < *nam)) {
          if ((*nam < 'A') || ('Z' < *nam)) {
            *nam = '_';
          }
        }
        else {
          *nam = *nam + -0x20;
        }
      }
      fprintf((FILE *)ofp,"%s\t%d",pcVar2,(ulong)c._4_4_);
      c._4_4_ = c._4_4_ + 1;
    }
    fprintf((FILE *)ofp,"\n\n#define\tNUMMONS\t%d\n",(ulong)c._4_4_);
    fprintf((FILE *)ofp,"\n#endif /* PM_H */\n");
    fclose((FILE *)ofp);
    return;
  }
  perror(outfile);
  exit(1);
}

Assistant:

void do_permonst(const char *outfile)
{
	int	i;
	char	*c, *nam;

	if (!(ofp = fopen(outfile, WRTMODE))) {
		perror(outfile);
		exit(EXIT_FAILURE);
	}
	
	fprintf(ofp,"%s", Dont_Edit_Code);
	fprintf(ofp,"#ifndef PM_H\n#define PM_H\n");

	if (strcmp(mons[0].mname, "playermon") != 0)
		fprintf(ofp,"\n#define\tPM_PLAYERMON\t(-1)");

	for (i = 0; mons[i].mlet; i++) {
		fprintf(ofp,"\n#define\tPM_");
		if (mons[i].mlet == S_HUMAN &&
				!strncmp(mons[i].mname, "were", 4))
		    fprintf(ofp, "HUMAN_");
		for (nam = c = tmpdup(mons[i].mname); *c; c++)
		    if (*c >= 'a' && *c <= 'z') *c -= (char)('a' - 'A');
		    else if (*c < 'A' || *c > 'Z') *c = '_';
		fprintf(ofp,"%s\t%d", nam, i);
	}
	fprintf(ofp,"\n\n#define\tNUMMONS\t%d\n", i);
	fprintf(ofp,"\n#endif /* PM_H */\n");
	fclose(ofp);
	return;
}